

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O1

void __thiscall Assimp::FBX::Scope::Scope(Scope *this,Parser *parser,bool topLevel)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer ppTVar3;
  TokenPtr token;
  int iVar4;
  undefined7 in_register_00000011;
  Token *token_00;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar5;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>
  local_88;
  int local_5c;
  long *local_58;
  long local_50;
  long local_48 [2];
  _Alloc_node local_38;
  
  p_Var1 = &(this->elements)._M_t._M_impl.super__Rb_tree_header;
  (this->elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->elements)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar4 = (int)CONCAT71(in_register_00000011,topLevel);
  if ((iVar4 == 0) && (token = parser->current, token->type != TokenType_OPEN_BRACKET)) {
    local_88.first._M_dataplus._M_p = (pointer)&local_88.first.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"expected open bracket","");
    if (token == (TokenPtr)0x0) {
      anon_unknown.dwarf_1299c88::ParseError(&local_88.first,(Element *)0x0);
    }
  }
  else {
    parser->last = parser->current;
    ppTVar3 = (parser->cursor)._M_current;
    if (ppTVar3 ==
        (parser->tokens->
        super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>)
        ._M_impl.super__Vector_impl_data._M_finish) {
      token_00 = (Token *)0x0;
    }
    else {
      (parser->cursor)._M_current = ppTVar3 + 1;
      token_00 = *ppTVar3;
    }
    parser->current = token_00;
    local_5c = iVar4;
    if (token_00 == (Token *)0x0) {
      local_88.first._M_dataplus._M_p = (pointer)&local_88.first.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"unexpected end of file","");
      anon_unknown.dwarf_1299c88::ParseError(&local_88.first,(Element *)0x0);
    }
    paVar2 = &local_88.first.field_2;
    while( true ) {
      if (token_00->type != TokenType_KEY) {
        if (token_00->type == TokenType_CLOSE_BRACKET) {
          return;
        }
        local_88.first._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,"unexpected token, expected TOK_KEY","");
        anon_unknown.dwarf_1299c88::ParseError(&local_88.first,token_00);
      }
      local_58 = local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,token_00->sbegin,token_00->send);
      token = (TokenPtr)operator_new(0x28);
      Element::Element((Element *)token,token_00,parser);
      local_88.first._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,local_58,local_50 + (long)local_58);
      local_88.second = (Element *)token;
      pVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
              ::_M_get_insert_equal_pos
                        ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
                          *)this,&local_88.first);
      local_38._M_t =
           (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
            *)this;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Assimp::FBX::Element*>,std::_Select1st<std::pair<std::__cxx11::string_const,Assimp::FBX::Element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Assimp::FBX::Element*>>>
      ::
      _M_insert_<std::pair<std::__cxx11::string_const,Assimp::FBX::Element*>,std::_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Assimp::FBX::Element*>,std::_Select1st<std::pair<std::__cxx11::string_const,Assimp::FBX::Element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Assimp::FBX::Element*>>>::_Alloc_node>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Assimp::FBX::Element*>,std::_Select1st<std::pair<std::__cxx11::string_const,Assimp::FBX::Element*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Assimp::FBX::Element*>>>
                  *)this,pVar5.first,pVar5.second,&local_88,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.first._M_dataplus._M_p != paVar2) {
        operator_delete(local_88.first._M_dataplus._M_p,
                        local_88.first.field_2._M_allocated_capacity + 1);
      }
      token_00 = parser->current;
      if (token_00 == (Token *)0x0) break;
      if (local_58 != local_48) {
        operator_delete(local_58,local_48[0] + 1);
      }
    }
    if ((char)local_5c != '\0') {
      if (local_58 == local_48) {
        return;
      }
      operator_delete(local_58,local_48[0] + 1);
      return;
    }
    local_88.first._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"unexpected end of file","")
    ;
    anon_unknown.dwarf_1299c88::ParseError(&local_88.first,parser->last);
  }
  anon_unknown.dwarf_1299c88::ParseError(&local_88.first,token);
}

Assistant:

Scope::Scope(Parser& parser,bool topLevel)
{
    if(!topLevel) {
        TokenPtr t = parser.CurrentToken();
        if (t->Type() != TokenType_OPEN_BRACKET) {
            ParseError("expected open bracket",t);
        }
    }

    TokenPtr n = parser.AdvanceToNextToken();
    if(n == NULL) {
        ParseError("unexpected end of file");
    }

    // note: empty scopes are allowed
    while(n->Type() != TokenType_CLOSE_BRACKET) {
        if (n->Type() != TokenType_KEY) {
            ParseError("unexpected token, expected TOK_KEY",n);
        }

        const std::string& str = n->StringContents();
        elements.insert(ElementMap::value_type(str,new_Element(*n,parser)));

        // Element() should stop at the next Key token (or right after a Close token)
        n = parser.CurrentToken();
        if(n == NULL) {
            if (topLevel) {
                return;
            }
            ParseError("unexpected end of file",parser.LastToken());
        }
    }
}